

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O3

size_t absl::numbers_internal::SixDigitsToBuffer(double d,char *buffer)

{
  char *pcVar1;
  uint64_t num;
  byte bVar2;
  undefined2 uVar3;
  byte bVar6;
  uint uVar4;
  ulong uVar5;
  char cVar7;
  char *pcVar9;
  uint uVar10;
  char cVar11;
  uint32_t i;
  uint64_t num_00;
  char *pcVar12;
  double dVar13;
  double dVar14;
  pair<unsigned_long,_unsigned_long> pVar15;
  pair<unsigned_long,_unsigned_long> pVar16;
  pair<unsigned_long,_unsigned_long> pVar17;
  ExpDigits exp_dig;
  uint local_48;
  char acStack_44 [2];
  char acStack_42 [2];
  uint local_40 [2];
  unsigned_long local_38;
  undefined2 uVar8;
  
  if (NAN(d)) {
    builtin_strncpy(buffer,"nan",4);
    return 3;
  }
  if ((d == 0.0) && (!NAN(d))) {
    pcVar9 = buffer;
    if ((long)d < 0) {
      pcVar9 = buffer + 1;
      *buffer = '-';
    }
    pcVar9[0] = '0';
    pcVar9[1] = '\0';
    return (size_t)(pcVar9 + (1 - (long)buffer));
  }
  pcVar9 = buffer;
  if (d < 0.0) {
    *buffer = '-';
    d = -d;
    pcVar9 = buffer + 1;
  }
  if (1.79769313486232e+308 < d) {
    builtin_strncpy(pcVar9,"inf",4);
    return (size_t)(pcVar9 + (3 - (long)buffer));
  }
  if (999999.5 <= d) {
    dVar13 = (double)(~-(ulong)(d < 1e+261) & (ulong)(d * 1e-256) | -(ulong)(d < 1e+261) & (ulong)d)
    ;
    uVar4 = (uint)(1e+261 <= d) * 0x100;
    uVar10 = uVar4 | 0x85;
    if (dVar13 < 1e+133) {
      uVar10 = uVar4 + 5;
    }
    dVar13 = (double)(~-(ulong)(dVar13 < 1e+133) & (ulong)(dVar13 * 1e-128) |
                     -(ulong)(dVar13 < 1e+133) & (ulong)dVar13);
    dVar14 = (double)(~-(ulong)(dVar13 < 1e+69) & (ulong)(dVar13 * 1e-64) |
                     -(ulong)(dVar13 < 1e+69) & (ulong)dVar13);
    uVar4 = uVar10 + 0x40;
    if (dVar13 < 1e+69) {
      uVar4 = uVar10;
    }
    uVar10 = uVar4 + 0x20;
    if (dVar14 < 1e+37) {
      uVar10 = uVar4;
    }
    dVar13 = (double)(~-(ulong)(dVar14 < 1e+37) & (ulong)(dVar14 * 1e-32) |
                     -(ulong)(dVar14 < 1e+37) & (ulong)dVar14);
    dVar14 = (double)(~-(ulong)(dVar13 < 1e+21) & (ulong)(dVar13 * 1e-16) |
                     -(ulong)(dVar13 < 1e+21) & (ulong)dVar13);
    uVar4 = uVar10 + 0x10;
    if (dVar13 < 1e+21) {
      uVar4 = uVar10;
    }
    uVar10 = uVar4 + 8;
    if (dVar14 < 10000000000000.0) {
      uVar10 = uVar4;
    }
    dVar13 = (double)(~-(ulong)(dVar14 < 10000000000000.0) & (ulong)(dVar14 * 1e-08) |
                     -(ulong)(dVar14 < 10000000000000.0) & (ulong)dVar14);
    dVar14 = (double)(~-(ulong)(dVar13 < 1000000000.0) & (ulong)(dVar13 * 0.0001) |
                     -(ulong)(dVar13 < 1000000000.0) & (ulong)dVar13);
    uVar4 = uVar10 + 4;
    if (dVar13 < 1000000000.0) {
      uVar4 = uVar10;
    }
    uVar10 = uVar4 + 2;
    if (dVar14 < 10000000.0) {
      uVar10 = uVar4;
    }
    dVar13 = (double)(~-(ulong)(dVar14 < 10000000.0) & (ulong)(dVar14 * 0.01) |
                     -(ulong)(dVar14 < 10000000.0) & (ulong)dVar14);
    if (1000000.0 <= dVar13) {
      uVar10 = uVar10 + 1;
      dVar14 = 0.1;
      goto LAB_001a0d0b;
    }
  }
  else {
    dVar13 = (double)(~-(ulong)(d < 1e-250) & (ulong)d | (ulong)(d * 1e+256) & -(ulong)(d < 1e-250))
    ;
    uVar4 = (uint)(1e-250 <= d) * 0x100;
    uVar10 = uVar4 | 0xfffffe85;
    if (1e-122 <= dVar13) {
      uVar10 = uVar4 - 0xfb;
    }
    dVar13 = (double)(~-(ulong)(dVar13 < 1e-122) & (ulong)dVar13 |
                     (ulong)(dVar13 * 1e+128) & -(ulong)(dVar13 < 1e-122));
    dVar14 = (double)(~-(ulong)(dVar13 < 1e-58) & (ulong)dVar13 |
                     (ulong)(dVar13 * 1e+64) & -(ulong)(dVar13 < 1e-58));
    uVar4 = uVar10 - 0x40;
    if (1e-58 <= dVar13) {
      uVar4 = uVar10;
    }
    uVar10 = uVar4 - 0x20;
    if (1e-26 <= dVar14) {
      uVar10 = uVar4;
    }
    dVar13 = (double)(~-(ulong)(dVar14 < 1e-26) & (ulong)dVar14 |
                     (ulong)(dVar14 * 1e+32) & -(ulong)(dVar14 < 1e-26));
    dVar14 = (double)(~-(ulong)(dVar13 < 1e-10) & (ulong)dVar13 |
                     (ulong)(dVar13 * 1e+16) & -(ulong)(dVar13 < 1e-10));
    uVar4 = uVar10 - 0x10;
    if (1e-10 <= dVar13) {
      uVar4 = uVar10;
    }
    uVar10 = uVar4 - 8;
    if (0.01 <= dVar14) {
      uVar10 = uVar4;
    }
    dVar13 = (double)(~-(ulong)(dVar14 < 0.01) & (ulong)dVar14 |
                     (ulong)(dVar14 * 100000000.0) & -(ulong)(dVar14 < 0.01));
    uVar4 = uVar10 - 4;
    if (100.0 <= dVar13) {
      uVar4 = uVar10;
    }
    dVar13 = (double)(~-(ulong)(dVar13 < 100.0) & (ulong)dVar13 |
                     (ulong)(dVar13 * 10000.0) & -(ulong)(dVar13 < 100.0));
    uVar10 = uVar4 - 2;
    if (10000.0 <= dVar13) {
      uVar10 = uVar4;
    }
    dVar13 = (double)(~-(ulong)(dVar13 < 10000.0) & (ulong)dVar13 |
                     (ulong)(dVar13 * 100.0) & -(ulong)(dVar13 < 10000.0));
    if (dVar13 < 100000.0) {
      uVar10 = uVar10 - 1;
      dVar14 = 10.0;
LAB_001a0d0b:
      dVar13 = dVar13 * dVar14;
    }
  }
  uVar5 = (ulong)(dVar13 * 65536.0);
  uVar5 = (long)(dVar13 * 65536.0 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
  if ((uVar5 & 0xffff) - 0x7fff < 2) {
    uVar4 = (uint)(uVar5 >> 0x10);
    dVar13 = frexp(d,(int *)&local_48);
    uVar5 = (ulong)(dVar13 * 9.223372036854776e+18);
    num = ((long)(dVar13 * 9.223372036854776e+18 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f |
          uVar5) * 2;
    num_00 = (ulong)(uVar4 * 2) + 1;
    if ((int)uVar10 < 6) {
      pVar16 = PowFive(num_00,0);
      local_38 = pVar16.second;
      pVar17 = PowFive(num,5 - uVar10);
      pVar15.second = local_38;
      pVar15.first = pVar16.first;
    }
    else {
      pVar15 = PowFive(num_00,uVar10 - 5);
      pVar17.second = 0;
      pVar17.first = num;
    }
    if ((pVar15.first < pVar17.first) ||
       ((pVar15.first <= pVar17.first && (pVar15.second < pVar17.second)))) {
      uVar4 = uVar4 + 1;
    }
    else if (pVar15 == pVar17) {
      uVar4 = (uVar4 & 1) + uVar4;
    }
  }
  else {
    uVar4 = (uint)(uVar5 + 0x8000 >> 0x10);
  }
  uVar5 = 100000;
  if (uVar4 != 1000000) {
    uVar5 = (ulong)uVar4;
  }
  local_48 = uVar10 + (uVar4 == 1000000);
  i = (uint32_t)(uVar5 / 10000);
  uVar10 = i * -10000 + (int)uVar5;
  PutTwoDigits(i,acStack_44);
  PutTwoDigits(uVar10 / 100,acStack_42);
  PutTwoDigits(uVar10 % 100,(char *)local_40);
  pcVar9[0] = '0';
  pcVar9[1] = '.';
  cVar11 = (char)_acStack_44;
  uVar8 = (undefined2)((uint)_acStack_44 >> 8);
  uVar3 = (undefined2)local_40[0];
  cVar7 = (char)((uint)_acStack_44 >> 0x18);
  bVar2 = (byte)local_40[0];
  bVar6 = (byte)(local_40[0] >> 8);
  switch(local_48) {
  case 0:
    *pcVar9 = cVar11;
    pcVar9[1] = '.';
    *(undefined2 *)(pcVar9 + 2) = uVar8;
    pcVar9[4] = cVar7;
    *(undefined2 *)(pcVar9 + 5) = uVar3;
    pcVar9 = pcVar9 + 8;
    do {
      cVar7 = pcVar9[-2];
      pcVar9 = pcVar9 + -1;
    } while (cVar7 == '0');
    break;
  case 1:
    *pcVar9 = cVar11;
    pcVar9[1] = (char)((uint)_acStack_44 >> 8);
    pcVar9[2] = '.';
    *(short *)(pcVar9 + 3) = (short)((uint)_acStack_44 >> 0x10);
    *(undefined2 *)(pcVar9 + 5) = uVar3;
    pcVar9 = pcVar9 + 8;
    do {
      cVar7 = pcVar9[-2];
      pcVar9 = pcVar9 + -1;
    } while (cVar7 == '0');
    break;
  case 2:
    *pcVar9 = cVar11;
    *(undefined2 *)(pcVar9 + 1) = uVar8;
    pcVar9[3] = '.';
    pcVar9[4] = cVar7;
    *(undefined2 *)(pcVar9 + 5) = uVar3;
    pcVar9 = pcVar9 + 8;
    do {
      cVar7 = pcVar9[-2];
      pcVar9 = pcVar9 + -1;
    } while (cVar7 == '0');
    break;
  case 3:
    *pcVar9 = cVar11;
    *(undefined2 *)(pcVar9 + 1) = uVar8;
    pcVar9[3] = cVar7;
    if ((bVar6 | bVar2) == 0x30) {
      pcVar9 = pcVar9 + 4;
    }
    else {
      pcVar9[4] = '.';
      pcVar9[5] = bVar2;
      if ((local_40[0] & 0xff00) != 0x3000) {
        pcVar9[6] = bVar6;
        goto LAB_001a1097;
      }
      pcVar9 = pcVar9 + 6;
    }
    goto LAB_001a109e;
  case 4:
    *pcVar9 = cVar11;
    *(undefined2 *)(pcVar9 + 1) = uVar8;
    pcVar9[3] = cVar7;
    pcVar9[4] = bVar2;
    if ((local_40[0] & 0xff00) == 0x3000) {
      pcVar9 = pcVar9 + 5;
    }
    else {
      pcVar9[5] = '.';
      pcVar9[6] = bVar6;
LAB_001a1097:
      pcVar9 = pcVar9 + 7;
    }
    goto LAB_001a109e;
  case 5:
    *pcVar9 = cVar11;
    *(undefined2 *)(pcVar9 + 1) = uVar8;
    pcVar9[3] = cVar7;
    *(undefined2 *)(pcVar9 + 4) = uVar3;
    pcVar9[6] = '\0';
    return (size_t)(pcVar9 + (6 - (long)buffer));
  case 0xfffffffc:
    pcVar9[2] = '0';
    pcVar9 = pcVar9 + 1;
  case 0xfffffffd:
    pcVar9[2] = '0';
    pcVar9 = pcVar9 + 1;
  case 0xfffffffe:
    goto switchD_001a0e7d_caseD_fffffffe;
  case 0xffffffff:
    goto switchD_001a0e7d_caseD_ffffffff;
  default:
    if (0xfffffff5 < local_48 - 6) {
      __assert_fail("exp < -4 || exp >= 6",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                    ,0x28a,
                    "size_t absl::numbers_internal::SixDigitsToBuffer(double, char *const _Nonnull)"
                   );
    }
    *pcVar9 = cVar11;
    *(undefined2 *)(pcVar9 + 2) = uVar8;
    pcVar9[4] = cVar7;
    *(undefined2 *)(pcVar9 + 5) = uVar3;
    pcVar9 = pcVar9 + 8;
    do {
      pcVar12 = pcVar9;
      pcVar9 = pcVar12 + -1;
    } while (pcVar12[-2] == '0');
    if (pcVar12[-2] == '.') {
      pcVar9 = pcVar12 + -2;
    }
    *pcVar9 = 'e';
    uVar10 = -local_48;
    if (0 < (int)local_48) {
      uVar10 = local_48;
    }
    uVar5 = (ulong)uVar10;
    pcVar9[1] = ((int)local_48 < 1) * '\x02' + '+';
    if (uVar10 < 100) {
      pcVar9 = pcVar9 + 2;
    }
    else {
      uVar10 = uVar10 % 100;
      pcVar9[2] = (char)(uVar5 / 100) + '0';
      pcVar9 = pcVar9 + 3;
    }
    PutTwoDigits(uVar10,pcVar9);
    pcVar9[2] = '\0';
    pcVar9 = pcVar9 + 2;
    goto LAB_001a10a2;
  }
  if (cVar7 == '.') {
    pcVar9 = pcVar9 + -1;
  }
LAB_001a109e:
  *pcVar9 = '\0';
LAB_001a10a2:
  return (size_t)(pcVar9 + -(long)buffer);
switchD_001a0e7d_caseD_fffffffe:
  pcVar9[2] = '0';
  pcVar9 = pcVar9 + 1;
switchD_001a0e7d_caseD_ffffffff:
  pcVar9[2] = cVar11;
  *(undefined2 *)(pcVar9 + 3) = uVar8;
  pcVar9[5] = cVar7;
  *(undefined2 *)(pcVar9 + 6) = uVar3;
  pcVar9 = pcVar9 + 9;
  pcVar12 = pcVar9 + -(long)buffer;
  do {
    pcVar12 = pcVar12 + -1;
    pcVar1 = pcVar9 + -2;
    pcVar9 = pcVar9 + -1;
  } while (*pcVar1 == '0');
  *pcVar9 = '\0';
  return (size_t)pcVar12;
}

Assistant:

size_t numbers_internal::SixDigitsToBuffer(double d,
                                           char* absl_nonnull const buffer) {
  static_assert(std::numeric_limits<float>::is_iec559,
                "IEEE-754/IEC-559 support only");

  char* out = buffer;  // we write data to out, incrementing as we go, but
                       // FloatToBuffer always returns the address of the buffer
                       // passed in.

  if (std::isnan(d)) {
    strcpy(out, "nan");  // NOLINT(runtime/printf)
    return 3;
  }
  if (d == 0) {  // +0 and -0 are handled here
    if (std::signbit(d)) *out++ = '-';
    *out++ = '0';
    *out = 0;
    return static_cast<size_t>(out - buffer);
  }
  if (d < 0) {
    *out++ = '-';
    d = -d;
  }
  if (d > std::numeric_limits<double>::max()) {
    strcpy(out, "inf");  // NOLINT(runtime/printf)
    return static_cast<size_t>(out + 3 - buffer);
  }

  auto exp_dig = SplitToSix(d);
  int exp = exp_dig.exponent;
  const char* digits = exp_dig.digits;
  out[0] = '0';
  out[1] = '.';
  switch (exp) {
    case 5:
      memcpy(out, &digits[0], 6), out += 6;
      *out = 0;
      return static_cast<size_t>(out - buffer);
    case 4:
      memcpy(out, &digits[0], 5), out += 5;
      if (digits[5] != '0') {
        *out++ = '.';
        *out++ = digits[5];
      }
      *out = 0;
      return static_cast<size_t>(out - buffer);
    case 3:
      memcpy(out, &digits[0], 4), out += 4;
      if ((digits[5] | digits[4]) != '0') {
        *out++ = '.';
        *out++ = digits[4];
        if (digits[5] != '0') *out++ = digits[5];
      }
      *out = 0;
      return static_cast<size_t>(out - buffer);
    case 2:
      memcpy(out, &digits[0], 3), out += 3;
      *out++ = '.';
      memcpy(out, &digits[3], 3);
      out += 3;
      while (out[-1] == '0') --out;
      if (out[-1] == '.') --out;
      *out = 0;
      return static_cast<size_t>(out - buffer);
    case 1:
      memcpy(out, &digits[0], 2), out += 2;
      *out++ = '.';
      memcpy(out, &digits[2], 4);
      out += 4;
      while (out[-1] == '0') --out;
      if (out[-1] == '.') --out;
      *out = 0;
      return static_cast<size_t>(out - buffer);
    case 0:
      memcpy(out, &digits[0], 1), out += 1;
      *out++ = '.';
      memcpy(out, &digits[1], 5);
      out += 5;
      while (out[-1] == '0') --out;
      if (out[-1] == '.') --out;
      *out = 0;
      return static_cast<size_t>(out - buffer);
    case -4:
      out[2] = '0';
      ++out;
      ABSL_FALLTHROUGH_INTENDED;
    case -3:
      out[2] = '0';
      ++out;
      ABSL_FALLTHROUGH_INTENDED;
    case -2:
      out[2] = '0';
      ++out;
      ABSL_FALLTHROUGH_INTENDED;
    case -1:
      out += 2;
      memcpy(out, &digits[0], 6);
      out += 6;
      while (out[-1] == '0') --out;
      *out = 0;
      return static_cast<size_t>(out - buffer);
  }
  assert(exp < -4 || exp >= 6);
  out[0] = digits[0];
  assert(out[1] == '.');
  out += 2;
  memcpy(out, &digits[1], 5), out += 5;
  while (out[-1] == '0') --out;
  if (out[-1] == '.') --out;
  *out++ = 'e';
  if (exp > 0) {
    *out++ = '+';
  } else {
    *out++ = '-';
    exp = -exp;
  }
  if (exp > 99) {
    int dig1 = exp / 100;
    exp -= dig1 * 100;
    *out++ = '0' + static_cast<char>(dig1);
  }
  PutTwoDigits(static_cast<uint32_t>(exp), out);
  out += 2;
  *out = 0;
  return static_cast<size_t>(out - buffer);
}